

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RendererParallelTests.cpp
# Opt level: O2

void __thiscall
agge::tests::RendererParallelTests::SingleThreadedRenderingIsDoneInSingleThread
          (RendererParallelTests *this)

{
  allocator local_239;
  thread_mapping mapping;
  thread_mapping_blender<unsigned_short,_unsigned_char> blender;
  bitmap<unsigned_short,_0UL,_0UL> bitmap;
  uint16_t reference [20];
  string local_1b8;
  LocationInfo local_198;
  mask_full<8UL> mask;
  cell cells3 [2];
  undefined1 local_130 [8];
  renderer_parallel r;
  undefined1 local_f8 [16];
  undefined4 local_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  undefined4 local_d8;
  cell local_d4;
  undefined1 local_c8 [16];
  undefined4 local_b8;
  undefined4 uStack_b4;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 local_a8;
  undefined1 local_a4 [8];
  mutex mtx;
  scanline_cells cells [3];
  
  cells[0].second = (cell *)local_a4;
  local_c8._0_4_ = 0;
  local_c8._4_4_ = 0;
  local_b8 = 0;
  uStack_ac = 0;
  local_c8._8_8_ = 0x200000011;
  uStack_b4 = 0xfffffffd;
  uStack_b0 = 4;
  local_a8 = 0xfffffff2;
  cells[1].second = &local_d4;
  local_e8 = 0;
  uStack_dc = 0;
  local_f8._0_4_ = 1;
  local_f8._4_4_ = 0;
  local_f8._8_8_ = 0x2000000ab;
  uStack_e4 = 0xffffffe2;
  uStack_e0 = 5;
  local_d8 = 0xffffff73;
  cells[2].second = (cell *)local_130;
  cells3[0].x = 1;
  cells3[0].area = 0;
  cells3[0].cover = 0xa0;
  cells3[1].x = 9;
  cells3[1].area = 0;
  cells3[1].cover = -0xa0;
  cells[0].first = (cell *)local_c8;
  cells[1].first = (cell *)local_f8;
  cells[2].first = cells3;
  mocks::mask<8ul>::
  mask<std::pair<agge::tests::mocks::cell_const*,agge::tests::mocks::cell_const*>,3>
            ((mask<8ul> *)&mask,&cells,1);
  mocks::bitmap<unsigned_short,_0UL,_0UL>::bitmap(&bitmap,5,4);
  mapping.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  mapping.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  mapping.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  mutex::mutex(&mtx);
  blender._mapping = &mapping;
  blender._mtx = &mtx;
  renderer_parallel::renderer_parallel(&r,1);
  renderer_parallel::operator()
            (&r,&bitmap,(vector_i)0x0,(rect_i *)0x0,&mask,&blender,
             (simple_alpha<unsigned_char,_8UL> *)reference);
  reference[8] = 0xe;
  reference[9] = 0;
  reference[10] = 0;
  reference[0xb] = 0xab;
  reference[0xc] = 0x8d;
  reference[0xd] = 0x8d;
  reference[0xe] = 0x8d;
  reference[0xf] = 0;
  reference[0] = 0;
  reference[1] = 0;
  reference[2] = 0;
  reference[3] = 0;
  reference[4] = 0;
  reference[5] = 0x11;
  reference[6] = 0x11;
  reference[7] = 0xe;
  reference[0x10] = 0xa0;
  reference[0x11] = 0xa0;
  reference[0x12] = 0xa0;
  reference[0x13] = 0xa0;
  std::__cxx11::string::string
            ((string *)&local_1b8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererParallelTests.cpp"
             ,&local_239);
  ut::LocationInfo::LocationInfo(&local_198,&local_1b8,0x77);
  ut::are_equal<unsigned_short,20ul,std::vector<unsigned_short,std::allocator<unsigned_short>>>
            ((unsigned_short (*) [20])reference,&bitmap.data,&local_198);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  renderer_parallel::~renderer_parallel(&r);
  mutex::~mutex(&mtx);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&mapping.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
            ((_Vector_base<unsigned_short,_std::allocator<unsigned_short>_> *)&bitmap);
  std::
  _Vector_base<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>,_std::allocator<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>_>_>
  ::~_Vector_base(&mask.super_mask<8UL>._cells.
                   super__Vector_base<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>,_std::allocator<std::pair<const_agge::tests::mocks::cell_*,_const_agge::tests::mocks::cell_*>_>_>
                 );
  return;
}

Assistant:

test( SingleThreadedRenderingIsDoneInSingleThread )
			{
				// INIT
				const mocks::cell cells1[] = { { 0, 0, 0x11 }, { 2, 0, -0x03 }, { 4, 0, -0x0E }, };
				const mocks::cell cells2[] = { { 1, 0, 0xAB }, { 2, 0, -0x1E }, { 5, 0, -0x8D }, };
				const mocks::cell cells3[] = { { 1, 0, 0xA0 }, { 9, 0, -0xA0 }, };
				mocks::mask<8>::scanline_cells cells[] = {
					make_pair(begin(cells1), end(cells1)),
					make_pair(begin(cells2), end(cells2)),
					make_pair(begin(cells3), end(cells3)),
				};
				mocks::mask_full<8> mask(cells, 1);
				mocks::bitmap<uint16_t> bitmap(5, 4);
				thread_mapping mapping;
				mutex mtx;
				mocks::thread_mapping_blender<uint16_t, uint8_t> blender(mapping, mtx);

				renderer_parallel r(1);

				// ACT
				r(bitmap, zero(), 0, mask, blender, mocks::simple_alpha<uint8_t, 8>());

				// ASSERT
				uint16_t reference[] = {
					0x0000, 0x0000, 0x0000, 0x0000, 0x0000,
					0x0011, 0x0011, 0x000E, 0x000E, 0x0000,
					0x0000, 0x00AB, 0x008D, 0x008D, 0x008D,
					0x0000, 0x00A0, 0x00A0, 0x00A0, 0x00A0,
				};

				assert_equal(reference, bitmap.data);
			}